

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_hookcall(lua_State *L,CallInfo *ci)

{
  long lVar1;
  int event_00;
  Proto *p;
  int event;
  CallInfo *ci_local;
  lua_State *L_local;
  
  L->oldpc = 0;
  if ((L->hookmask & 1U) != 0) {
    event_00 = 0;
    if ((ci->callstatus & 0x20) != 0) {
      event_00 = 4;
    }
    lVar1 = *(long *)((((ci->func).p)->val).value_.f + 0x18);
    (ci->u).l.savedpc = (Instruction *)((ci->u).c.k + 4);
    luaD_hook(L,event_00,-1,1,(uint)*(byte *)(lVar1 + 10));
    (ci->u).l.savedpc = (Instruction *)((ci->u).c.k + -4);
  }
  return;
}

Assistant:

void luaD_hookcall (lua_State *L, CallInfo *ci) {
  L->oldpc = 0;  /* set 'oldpc' for new function */
  if (L->hookmask & LUA_MASKCALL) {  /* is call hook on? */
    int event = (ci->callstatus & CIST_TAIL) ? LUA_HOOKTAILCALL
                                             : LUA_HOOKCALL;
    Proto *p = ci_func(ci)->p;
    ci->u.l.savedpc++;  /* hooks assume 'pc' is already incremented */
    luaD_hook(L, event, -1, 1, p->numparams);
    ci->u.l.savedpc--;  /* correct 'pc' */
  }
}